

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
SimpleParallelSimulationDataGenerator::Initialize
          (SimpleParallelSimulationDataGenerator *this,U32 simulation_sample_rate,
          SimpleParallelAnalyzerSettings *settings)

{
  byte bVar1;
  size_type sVar2;
  reference pvVar3;
  SimulationChannelDescriptor *pSVar4;
  value_type local_52;
  value_type pSStack_50;
  U16 val;
  Channel local_38 [16];
  uint local_28;
  uint local_24;
  U32 i;
  U32 count;
  SimpleParallelAnalyzerSettings *settings_local;
  SimpleParallelSimulationDataGenerator *pSStack_10;
  U32 simulation_sample_rate_local;
  SimpleParallelSimulationDataGenerator *this_local;
  
  this->mSettings = settings;
  this->mSimulationSampleRateHz = simulation_sample_rate;
  _i = settings;
  settings_local._4_4_ = simulation_sample_rate;
  pSStack_10 = this;
  std::vector<SimulationChannelDescriptor_*,_std::allocator<SimulationChannelDescriptor_*>_>::clear
            (&this->mData);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::clear(&this->mDataMasks);
  sVar2 = std::vector<Channel,_std::allocator<Channel>_>::size(&this->mSettings->mDataChannels);
  local_24 = (uint)sVar2;
  for (local_28 = 0; local_28 < local_24; local_28 = local_28 + 1) {
    pvVar3 = std::vector<Channel,_std::allocator<Channel>_>::operator[]
                       (&this->mSettings->mDataChannels,(ulong)local_28);
    Channel::Channel(local_38,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
    bVar1 = Channel::operator==(pvVar3,local_38);
    Channel::~Channel(local_38);
    if ((bVar1 & 1) == 0) {
      pvVar3 = std::vector<Channel,_std::allocator<Channel>_>::operator[]
                         (&this->mSettings->mDataChannels,(ulong)local_28);
      pSStack_50 = (value_type)
                   SimulationChannelDescriptorGroup::Add
                             ((Channel *)&this->mSimulationData,(uint)pvVar3,
                              this->mSimulationSampleRateHz);
      std::vector<SimulationChannelDescriptor_*,_std::allocator<SimulationChannelDescriptor_*>_>::
      push_back(&this->mData,&stack0xffffffffffffffb0);
      local_52 = (value_type)(1 << ((byte)local_28 & 0x1f));
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                (&this->mDataMasks,&local_52);
    }
  }
  if (this->mSettings->mClockEdge == NegEdge) {
    pSVar4 = (SimulationChannelDescriptor *)
             SimulationChannelDescriptorGroup::Add
                       ((Channel *)&this->mSimulationData,(int)this->mSettings + 0x28,
                        this->mSimulationSampleRateHz);
    this->mClock = pSVar4;
  }
  else if (this->mSettings->mClockEdge == PosEdge) {
    pSVar4 = (SimulationChannelDescriptor *)
             SimulationChannelDescriptorGroup::Add
                       ((Channel *)&this->mSimulationData,(int)this->mSettings + 0x28,
                        this->mSimulationSampleRateHz);
    this->mClock = pSVar4;
  }
  else if (this->mSettings->mClockEdge == DualEdge) {
    pSVar4 = (SimulationChannelDescriptor *)
             SimulationChannelDescriptorGroup::Add
                       ((Channel *)&this->mSimulationData,(int)this->mSettings + 0x28,
                        this->mSimulationSampleRateHz);
    this->mClock = pSVar4;
  }
  this->mValue = 0;
  return;
}

Assistant:

void SimpleParallelSimulationDataGenerator::Initialize( U32 simulation_sample_rate, SimpleParallelAnalyzerSettings* settings )
{
    mSettings = settings;
    mSimulationSampleRateHz = simulation_sample_rate;

    mData.clear();
    mDataMasks.clear();

    U32 count = mSettings->mDataChannels.size();
    for( U32 i = 0; i < count; i++ )
    {
        if( mSettings->mDataChannels[ i ] == UNDEFINED_CHANNEL )
            continue;
        mData.push_back( mSimulationData.Add( mSettings->mDataChannels[ i ], mSimulationSampleRateHz, BIT_LOW ) );
        U16 val = 1 << i;
        mDataMasks.push_back( val );
    }

    if( mSettings->mClockEdge == ParallelAnalyzerClockEdge::NegEdge )
    {
        mClock = mSimulationData.Add( mSettings->mClockChannel, mSimulationSampleRateHz, BIT_LOW );
    }
    else if( mSettings->mClockEdge == ParallelAnalyzerClockEdge::PosEdge )
    {
        mClock = mSimulationData.Add( mSettings->mClockChannel, mSimulationSampleRateHz, BIT_HIGH );
    }
    else if( mSettings->mClockEdge == ParallelAnalyzerClockEdge::DualEdge )
    {
        mClock = mSimulationData.Add( mSettings->mClockChannel, mSimulationSampleRateHz, BIT_HIGH );
    }

    mValue = 0;
}